

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_lit.c
# Opt level: O3

void arg_lit_errorfn(arg_lit *parent,arg_dstr_t ds,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *datatype;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  datatype = (parent->hdr).datatype;
  if (errorcode == 2) {
    arg_dstr_catf(ds,"%s: extraneous option ",progname);
    arg_print_option_ds(ds,shortopts,longopts,datatype,"\n");
    return;
  }
  if (errorcode == 1) {
    arg_dstr_catf(ds,"%s: missing option ",progname);
    arg_print_option_ds(ds,shortopts,longopts,datatype,"\n");
    arg_dstr_cat(ds,"\n");
    return;
  }
  return;
}

Assistant:

static void arg_lit_errorfn(struct arg_lit* parent, arg_dstr_t ds, int errorcode, const char* argval, const char* progname) {
    const char* shortopts = parent->hdr.shortopts;
    const char* longopts = parent->hdr.longopts;
    const char* datatype = parent->hdr.datatype;

    switch (errorcode) {
        case ARG_ERR_MINCOUNT:
            arg_dstr_catf(ds, "%s: missing option ", progname);
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            arg_dstr_cat(ds, "\n");
            break;

        case ARG_ERR_MAXCOUNT:
            arg_dstr_catf(ds, "%s: extraneous option ", progname);
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;
    }

    ARG_TRACE(("%s:errorfn(%p, %p, %d, %s, %s)\n", __FILE__, parent, ds, errorcode, argval, progname));
}